

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

value_type __thiscall djb::utia::eval(utia *this,vec3 *wi,vec3 *wo,void *param_3)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_EAX;
  uint uVar4;
  pointer pdVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  int iVar13;
  bool bVar14;
  int iVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int iVar21;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined8 uVar22;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar24 [16];
  int iVar26;
  int iVar29;
  undefined1 auVar27 [16];
  int iVar30;
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  float fVar33;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar43;
  undefined1 auVar42 [16];
  uint uVar44;
  uint uVar45;
  value_type vVar46;
  float_t RGB [3];
  float local_108;
  float local_e8;
  float fStack_e4;
  float local_b8;
  float fStack_b4;
  float fStack_a4;
  ulong local_78;
  float local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  fVar17 = acosf(wo->z);
  fVar17 = fVar17 * 57.295776;
  fVar18 = acosf(*(float *)((long)param_3 + 8));
  fVar19 = atan2f(wo->y,wo->x);
  fVar20 = atan2f(*(float *)((long)param_3 + 4),*param_3);
  if ((90.0 <= fVar17) || (fVar18 = fVar18 * 57.295776, 90.0 <= fVar18)) {
    (**(code **)(*(long *)wi + 0x10))(this);
    pfVar9 = extraout_RDX_00;
  }
  else {
    auVar23._0_4_ = fVar20 * 57.295776;
    auVar23._4_12_ = extraout_var;
    for (fVar19 = fVar19 * 57.295776; fVar20 = auVar23._0_4_, fVar19 < 0.0; fVar19 = fVar19 + 360.0)
    {
    }
    while (fVar33 = auVar23._0_4_, fVar20 < 0.0) {
      auVar23._0_4_ = fVar33 + 360.0;
      fVar20 = auVar23._0_4_;
    }
    uVar22 = auVar23._0_8_;
    for (; 360.0 <= fVar19; fVar19 = fVar19 + -360.0) {
    }
    while (360.0 <= fVar33) {
      auVar23._0_4_ = auVar23._0_4_ + -360.0;
      uVar22 = auVar23._0_8_;
      fVar33 = auVar23._0_4_;
    }
    fVar20 = floorf(fVar17 / 15.0);
    iVar2 = (int)fVar20;
    iVar26 = 5;
    iVar29 = 4;
    if (iVar2 < 5) {
      iVar26 = iVar2 + 1;
      iVar29 = iVar2;
    }
    fVar20 = floorf(fVar18 / 15.0);
    iVar3 = (int)fVar20;
    iVar2 = 5;
    if (iVar3 < 5) {
      iVar2 = iVar3 + 1;
    }
    iVar8 = 4;
    if (iVar3 < 5) {
      iVar8 = iVar3;
    }
    iVar30 = 5;
    iVar21 = 4;
    if (iVar3 < 5) {
      iVar30 = iVar3 + 1;
      iVar21 = iVar3;
    }
    fVar20 = (float)uVar22;
    fVar33 = (float)((ulong)uVar22 >> 0x20);
    auVar40._8_4_ = fVar33;
    auVar40._0_8_ = uVar22;
    auVar40._12_4_ = extraout_XMM0_Db_01;
    auVar35._8_8_ = auVar40._8_8_;
    auVar35._4_4_ = fVar19;
    auVar35._0_4_ = fVar20;
    auVar23 = divps(auVar35,_DAT_001b22b0);
    auVar34._0_4_ = (float)iVar26 * 15.0 + -fVar17;
    auVar34._4_4_ = (float)iVar29 * -15.0 + fVar17;
    auVar34._8_4_ = -extraout_XMM0_Db + 0.0;
    auVar34._12_4_ = extraout_XMM0_Db + 0.0;
    auVar38._0_4_ = auVar34._4_4_ + auVar34._0_4_;
    auVar38._4_4_ = auVar38._0_4_;
    auVar38._8_4_ = auVar38._0_4_;
    auVar38._12_4_ = auVar38._0_4_;
    auVar35 = divps(auVar34,auVar38);
    auVar39._0_4_ = (float)iVar30 * 15.0 + -fVar18;
    auVar39._4_4_ = (float)iVar21 * -15.0 + fVar18;
    auVar39._8_4_ = -extraout_XMM0_Db_00 + 0.0;
    auVar39._12_4_ = extraout_XMM0_Db_00 + 0.0;
    auVar27._0_4_ = auVar39._4_4_ + auVar39._0_4_;
    auVar27._4_4_ = auVar27._0_4_;
    auVar27._8_4_ = auVar27._0_4_;
    auVar27._12_4_ = auVar27._0_4_;
    auVar40 = divps(auVar39,auVar27);
    local_108 = -fVar19;
    fVar17 = floorf(auVar23._0_4_);
    fStack_a4 = auVar23._4_4_;
    fVar18 = floorf(fStack_a4);
    local_b8 = auVar40._0_4_;
    fStack_b4 = auVar40._4_4_;
    iVar21 = (int)fVar17;
    iVar25 = (int)fVar18;
    iVar3 = iVar21 + 1;
    iVar30 = iVar25 + 1;
    auVar41._0_4_ = (float)iVar30 * 7.5 + local_108;
    auVar41._4_4_ = (float)iVar25 * -7.5 + fVar19;
    auVar41._8_4_ = (float)iVar30 * 0.0 + extraout_XMM0_Dc;
    auVar41._12_4_ = (float)iVar25 * 0.0 + extraout_XMM0_Dd;
    auVar36._0_4_ = auVar41._4_4_ + auVar41._0_4_;
    auVar36._4_4_ = auVar36._0_4_;
    auVar36._8_4_ = auVar36._0_4_;
    auVar36._12_4_ = auVar36._0_4_;
    auVar23 = divps(auVar41,auVar36);
    auVar42._0_4_ = (float)iVar3 * 7.5 + -fVar20;
    auVar42._4_4_ = (float)iVar21 * -7.5 + fVar20;
    auVar42._8_4_ = (float)iVar30 * 0.0 + -fVar33;
    auVar42._12_4_ = (float)iVar25 * 0.0 + fVar33;
    auVar24._0_4_ = auVar42._4_4_ + auVar42._0_4_;
    auVar24._4_4_ = auVar24._0_4_;
    auVar24._8_4_ = auVar24._0_4_;
    auVar24._12_4_ = auVar24._0_4_;
    auVar31._0_4_ = -(uint)(iVar3 == 0x30);
    auVar31._4_4_ = -(uint)(iVar3 == 0x30);
    auVar31._8_4_ = -(uint)(iVar30 == 0x30);
    auVar31._12_4_ = -(uint)(iVar30 == 0x30);
    auVar40 = divps(auVar42,auVar24);
    uVar4 = movmskpd(extraout_EAX,auVar31);
    lVar6 = 0;
    if ((uVar4 & 2) != 0) {
      iVar30 = 0;
    }
    if ((uVar4 & 1) != 0) {
      iVar3 = 0;
    }
    uVar43 = auVar40._4_4_;
    uVar4 = auVar23._4_4_;
    fStack_e4 = auVar35._4_4_;
    local_58 = fStack_b4;
    fStack_54 = fStack_b4;
    fStack_50 = fStack_b4;
    fStack_4c = fStack_b4;
    local_68 = fStack_e4;
    fStack_64 = fStack_e4;
    fStack_60 = fStack_e4;
    fStack_5c = fStack_e4;
    uVar44 = uVar4;
    uVar45 = uVar4;
    local_48 = uVar4;
    uStack_44 = uVar4;
    uStack_40 = uVar4;
    uStack_3c = uVar4;
    do {
      fVar19 = 0.0;
      local_e8 = auVar35._0_4_;
      iVar11 = iVar29;
      bVar1 = true;
      do {
        bVar7 = bVar1;
        iVar13 = iVar8;
        bVar1 = true;
        fVar17 = local_b8;
        do {
          bVar12 = bVar1;
          auVar32 = auVar23;
          iVar15 = iVar25;
          bVar1 = true;
          do {
            bVar14 = bVar1;
            auVar37 = auVar40;
            iVar10 = iVar21;
            bVar1 = true;
            do {
              bVar16 = bVar1;
              fVar19 = fVar19 + (float)*(double *)
                                        (*(long *)&wi->z +
                                        (long)(iVar10 + (iVar15 + iVar11 * 0x30) * 0x120 +
                                                        (int)lVar6 * 0x14400 + iVar13 * 0x30) * 8) *
                                auVar37._0_4_ * auVar32._0_4_ * fVar17 * local_e8;
              auVar37._4_4_ = 0;
              auVar37._0_4_ = uVar43;
              auVar37._8_4_ = uVar43;
              auVar37._12_4_ = uVar43;
              iVar10 = iVar3;
              bVar1 = false;
            } while (bVar16);
            auVar32._4_4_ = 0;
            auVar32._0_4_ = uVar4;
            auVar32._8_4_ = uVar44;
            auVar32._12_4_ = uVar45;
            iVar15 = iVar30;
            bVar1 = false;
          } while (bVar14);
          iVar13 = iVar2;
          bVar1 = false;
          fVar17 = fStack_b4;
        } while (bVar12);
        iVar11 = iVar26;
        bVar1 = false;
        local_e8 = fStack_e4;
      } while (bVar7);
      if (fVar19 <= 0.0375) {
        fVar19 = fVar19 / 12.92;
      }
      else {
        fVar19 = powf((fVar19 + 0.055) / 1.055,2.4);
        uVar4 = local_48;
        uVar44 = uStack_40;
        uVar45 = uStack_3c;
        fStack_b4 = local_58;
        fStack_e4 = local_68;
      }
      *(float *)((long)&local_78 + lVar6 * 4) = fVar19 * 100.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    fVar19 = *(float *)((long)param_3 + 8);
    fVar17 = 0.0;
    if (0.0 <= local_70) {
      fVar17 = local_70;
    }
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_78;
    auVar23 = maxps(ZEXT816(0),auVar28);
    (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)0x3;
    pdVar5 = (pointer)operator_new(0xc);
    (this->m_samples).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = pdVar5;
    *pdVar5 = (double)CONCAT44(fVar19 * auVar23._4_4_,fVar19 * auVar23._0_4_);
    *(float *)(pdVar5 + 1) = fVar17 * fVar19;
    pfVar9 = extraout_RDX;
  }
  vVar46._M_data = pfVar9;
  vVar46._M_size = (size_t)this;
  return vVar46;
}

Assistant:

brdf::value_type
utia::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	float_t r2d = 180 / m_pi();
	float_t theta_i = r2d * acos(wi.z);
	float_t theta_o = r2d * acos(wo.z);
	float_t phi_i = r2d * atan2(wi.y, wi.x);
	float_t phi_o = r2d * atan2(wo.y, wo.x);

	// make sure we're above horizon
	if (theta_i >= 90 || theta_o >= 90)
		return zero_value();

	// make sure phi is in [0, 360)
	while (phi_i < 0) {phi_i+= 360;}
	while (phi_o < 0) {phi_o+= 360;}
	while (phi_i >= 360) {phi_i-= 360;}
	while (phi_o >= 360) {phi_o-= 360;}

	int iti[2], itv[2], ipi[2], ipv[2];
	iti[0] = (int)floor(theta_i / DJB__UTIA_STEP_T);
	iti[1] = iti[0] + 1;
	if(iti[0] > DJB__UTIA_NTI - 2) {
		iti[0] = DJB__UTIA_NTI - 2;
		iti[1] = DJB__UTIA_NTI - 1;
	}
	itv[0] = (int)floor(theta_o / DJB__UTIA_STEP_T);
	itv[1] = itv[0] + 1;
	if(itv[0] > DJB__UTIA_NTV - 2) {
		itv[0] = DJB__UTIA_NTV - 2;
		itv[1] = DJB__UTIA_NTV - 1;
	}

	ipi[0] = (int)floor(phi_i / DJB__UTIA_STEP_P);
	ipi[1] = ipi[0] + 1;
	ipv[0] = (int)floor(phi_o / DJB__UTIA_STEP_P);
	ipv[1] = ipv[0] + 1;

	float_t sum;
	float_t wti[2], wtv[2], wpi[2], wpv[2];
	wti[1] = theta_i - (float_t)(DJB__UTIA_STEP_T * iti[0]);
	wti[0] = (float_t)(DJB__UTIA_STEP_T * iti[1]) - theta_i;
	sum = wti[0] + wti[1];
	wti[0]/= sum;
	wti[1]/= sum;
	wtv[1] = theta_o - (float_t)(DJB__UTIA_STEP_T * itv[0]);
	wtv[0] = (float_t)(DJB__UTIA_STEP_T * itv[1]) - theta_o;
	sum = wtv[0] + wtv[1];
	wtv[0]/= sum;
	wtv[1]/= sum;

	wpi[1] = phi_i - (float_t)(DJB__UTIA_STEP_P * ipi[0]);
	wpi[0] = (float_t)(DJB__UTIA_STEP_P * ipi[1]) - phi_i;
	sum = wpi[0] + wpi[1];
	wpi[0]/= sum;
	wpi[1]/= sum;
	wpv[1] = phi_o - (float_t)(DJB__UTIA_STEP_P * ipv[0]);
	wpv[0] = (float_t)(DJB__UTIA_STEP_P * ipv[1]) - phi_o;
	sum = wpv[0] + wpv[1];
	wpv[0]/= sum;
	wpv[1]/= sum;

	if(ipi[1] == DJB__UTIA_NPI)
		ipi[1] = 0;
	if(ipv[1] == DJB__UTIA_NPV)
		ipv[1] = 0;

	int nc = DJB__UTIA_NPV * DJB__UTIA_NTV;
	int nr = DJB__UTIA_NPI * DJB__UTIA_NTI;
	float_t RGB[DJB__UTIA_PLANES];
	for(int isp = 0; isp < DJB__UTIA_PLANES; ++isp) {
		int i, j, k, l;

		RGB[isp] = 0;
		for(i = 0; i < 2; ++i)
		for(j = 0; j < 2; ++j)
		for(k = 0; k < 2; ++k)
		for(l = 0; l < 2; ++l) {
			float_t w = wti[i] * wtv[j] * wpi[k] * wpv[l];
			int idx = isp * nr * nc + nc * (DJB__UTIA_NPI * iti[i] + ipi[k]) 
			        + DJB__UTIA_NPV * itv[j] + ipv[l];

			RGB[isp]+= w * (float_t)m_samples[idx];
		}
		if (RGB[isp] > (float_t)0.0375)
			RGB[isp] = pow((RGB[isp] + (float_t)0.055)/(float_t)1.055, (float_t)2.4);
		else
			RGB[isp]/= (float_t)12.92;
		RGB[isp]*= 100;
	}

	vec3 rgb = wo.z * vec3(
		max((float_t)0, RGB[0]),
		max((float_t)0, RGB[1]),
		max((float_t)0, RGB[2])
	);

	return brdf::value_type(&rgb[0], 3);
}